

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O2

ws_frame_type __thiscall
cinatra::websocket::parse_payload(websocket *this,span<char,_18446744073709551615UL> buf)

{
  size_t i;
  ulong uVar1;
  
  if (*(int *)this->mask_key_ != 0) {
    for (uVar1 = 0; uVar1 < this->payload_length_; uVar1 = uVar1 + 1) {
      buf._M_ptr[uVar1] = buf._M_ptr[uVar1] ^ this->mask_key_[(uint)uVar1 & 3];
    }
  }
  switch(this->msg_opcode_) {
  case '\0':
  case '\x01':
    return (uint)(this->msg_fin_ != '\0') * 0x80 + WS_INCOMPLETE_TEXT_FRAME;
  case '\x02':
    return (uint)(this->msg_fin_ != '\0') << 7 | WS_INCOMPLETE_BINARY_FRAME;
  default:
    return WS_ERROR_FRAME;
  case '\b':
    return WS_CLOSE_FRAME;
  case '\t':
    return WS_PING_FRAME;
  case '\n':
    return WS_PONG_FRAME;
  }
}

Assistant:

ws_frame_type parse_payload(std::span<char> buf) {
    // unmask data:
    if (*(uint32_t *)mask_key_ != 0) {
      for (size_t i = 0; i < payload_length_; i++) {
        buf[i] = buf[i] ^ mask_key_[i % 4];
      }
    }

    if (msg_opcode_ == 0x0)
      return (msg_fin_)
                 ? ws_frame_type::WS_TEXT_FRAME
                 : ws_frame_type::WS_INCOMPLETE_TEXT_FRAME;  // continuation
    // frame ?
    if (msg_opcode_ == 0x1)
      return (msg_fin_) ? ws_frame_type::WS_TEXT_FRAME
                        : ws_frame_type::WS_INCOMPLETE_TEXT_FRAME;
    if (msg_opcode_ == 0x2)
      return (msg_fin_) ? ws_frame_type::WS_BINARY_FRAME
                        : ws_frame_type::WS_INCOMPLETE_BINARY_FRAME;
    if (msg_opcode_ == 0x8)
      return ws_frame_type::WS_CLOSE_FRAME;
    if (msg_opcode_ == 0x9)
      return ws_frame_type::WS_PING_FRAME;
    if (msg_opcode_ == 0xA)
      return ws_frame_type::WS_PONG_FRAME;
    return ws_frame_type::WS_ERROR_FRAME;
  }